

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_constrained_multi_parallelogram_encoder.h
# Opt level: O2

void __thiscall
draco::
MeshPredictionSchemeConstrainedMultiParallelogramEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
::MeshPredictionSchemeConstrainedMultiParallelogramEncoder
          (MeshPredictionSchemeConstrainedMultiParallelogramEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           *this,PointAttribute *attribute,
          PredictionSchemeWrapEncodingTransform<int,_int> *transform,
          MeshPredictionSchemeData<draco::MeshAttributeCornerTable> *mesh_data)

{
  long lVar1;
  
  MeshPredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  ::MeshPredictionSchemeEncoder
            (&this->
              super_MeshPredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
             ,attribute,transform,mesh_data);
  (this->
  super_MeshPredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  ).super_PredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>_>.
  super_PredictionSchemeTypedEncoderInterface<int,_int>.super_PredictionSchemeEncoderInterface.
  super_PredictionSchemeInterface._vptr_PredictionSchemeInterface =
       (_func_int **)&PTR__MeshPredictionSchemeConstrainedMultiParallelogramEncoder_001d3b60;
  lVar1 = 0x80;
  do {
    *(undefined8 *)((long)this->is_crease_edge_ + lVar1 + -0x80) = 0;
    *(undefined4 *)((long)(this->is_crease_edge_ + -3) + lVar1) = 0;
    *(undefined8 *)((long)this->is_crease_edge_ + lVar1 + -0x70) = 0;
    *(undefined4 *)((long)this->is_crease_edge_ + lVar1 + -0x68) = 0;
    *(undefined8 *)((long)this->is_crease_edge_ + lVar1 + -0x60) = 0;
    lVar1 = lVar1 + 0x28;
  } while (lVar1 != 0x120);
  this->selected_mode_ = OPTIMAL_MULTI_PARALLELOGRAM;
  ShannonEntropyTracker::ShannonEntropyTracker(&this->entropy_tracker_);
  (this->entropy_symbols_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->entropy_symbols_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->entropy_symbols_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

MeshPredictionSchemeConstrainedMultiParallelogramEncoder(
      const PointAttribute *attribute, const TransformT &transform,
      const MeshDataT &mesh_data)
      : MeshPredictionSchemeEncoder<DataTypeT, TransformT, MeshDataT>(
            attribute, transform, mesh_data),
        selected_mode_(Mode::OPTIMAL_MULTI_PARALLELOGRAM) {}